

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O1

UniValue *
generateBlocks(UniValue *__return_storage_ptr__,ChainstateManager *chainman,Mining *miner,
              CScript *coinbase_script,int nGenerate,uint64_t nMaxTries)

{
  UniValue val;
  bool bVar1;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> block_out;
  unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
  block_template;
  undefined1 in_stack_fffffffffffffe78 [12];
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 in_stack_fffffffffffffea8;
  _Head_base<0UL,_interfaces::BlockTemplate_*,_false> in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffec0 [16];
  UniValue local_120;
  CBlock local_c8;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if (nGenerate < 1) break;
    bVar1 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
    if (bVar1) break;
    local_c8.super_CBlockHeader.nVersion._0_1_ = 1;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xa0;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\x0f';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x90;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\x01';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    (*miner->_vptr_Mining[6])
              ((unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
                *)&stack0xfffffffffffffeb0,miner,coinbase_script,&local_c8);
    inline_check_non_fatal<std::unique_ptr<interfaces::BlockTemplate,std::default_delete<interfaces::BlockTemplate>>&>
              ((unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
                *)&stack0xfffffffffffffeb0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp"
               ,0xa5,"generateBlocks","block_template");
    this = (element_type *)0x0;
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (**(code **)(*(long *)in_stack_fffffffffffffeb0._M_head_impl + 0x18))(&local_c8);
    bVar1 = GenerateBlock(chainman,miner,&local_c8,(uint64_t *)&stack0xfffffffffffffeb8,
                          (shared_ptr<const_CBlock> *)&stack0xfffffffffffffe98,true);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_c8.vtx);
    if ((bVar1) && (this != (element_type *)0x0)) {
      CBlockHeader::GetHash((uint256 *)&stack0xfffffffffffffec0,&this->super_CBlockHeader);
      base_blob<256u>::GetHex_abi_cxx11_((string *)&local_c8,(uint256 *)&stack0xfffffffffffffec0);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      val.val._M_dataplus._M_p._4_4_ = nGenerate;
      val._0_12_ = in_stack_fffffffffffffe78;
      val.val._M_string_length = (size_type)__return_storage_ptr__;
      val.val.field_2._M_allocated_capacity = (size_type)coinbase_script;
      val.val.field_2._8_8_ = this;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00._M_pi;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffea8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)in_stack_fffffffffffffeb0._M_head_impl;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)nMaxTries;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffec0._0_8_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffec0._8_8_;
      UniValue::push_back(__return_storage_ptr__,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_120.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_120.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.val._M_dataplus._M_p != &local_120.val.field_2) {
        operator_delete(local_120.val._M_dataplus._M_p,
                        local_120.val.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)
          CONCAT71(local_c8.super_CBlockHeader._1_7_,
                   (undefined1)local_c8.super_CBlockHeader.nVersion) !=
          local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
        operator_delete((undefined1 *)
                        CONCAT71(local_c8.super_CBlockHeader._1_7_,
                                 (undefined1)local_c8.super_CBlockHeader.nVersion),
                        local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                        _M_elems._12_8_ + 1);
      }
      nGenerate = nGenerate + -1;
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (in_stack_fffffffffffffeb0._M_head_impl != (BlockTemplate *)0x0) {
      (*(in_stack_fffffffffffffeb0._M_head_impl)->_vptr_BlockTemplate[1])();
    }
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue generateBlocks(ChainstateManager& chainman, Mining& miner, const CScript& coinbase_script, int nGenerate, uint64_t nMaxTries)
{
    UniValue blockHashes(UniValue::VARR);
    while (nGenerate > 0 && !chainman.m_interrupt) {
        std::unique_ptr<BlockTemplate> block_template(miner.createNewBlock(coinbase_script));
        CHECK_NONFATAL(block_template);

        std::shared_ptr<const CBlock> block_out;
        if (!GenerateBlock(chainman, miner, block_template->getBlock(), nMaxTries, block_out, /*process_new_block=*/true)) {
            break;
        }

        if (block_out) {
            --nGenerate;
            blockHashes.push_back(block_out->GetHash().GetHex());
        }
    }
    return blockHashes;
}